

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float64_suite::fail_array8_float64_overflow(void)

{
  pointer buffer;
  size_type size;
  undefined4 local_6c;
  size_type local_68 [2];
  array<double,_1UL> local_58;
  array<double,_1UL> value;
  decoder decoder;
  value_type input [18];
  
  decoder.current.view._M_str = (uchar *)0x10af;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[18]>
            ((decoder *)&value,(uchar (*) [18])&decoder.current.view._M_str);
  memset(&local_58,0,8);
  buffer = std::array<double,_1UL>::data(&local_58);
  size = std::array<double,_1UL>::size(&local_58);
  local_68[0] = trial::protocol::bintoken::detail::decoder::array
                          ((decoder *)&value,(type *)buffer,size);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf5a,"void compact_float64_suite::fail_array8_float64_overflow()",local_68,&local_6c)
  ;
  return;
}

Assistant:

void fail_array8_float64_overflow()
{
    const value_type input[] = { token::code::array8_float64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float64::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}